

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void * __thiscall
google::protobuf::FileDescriptorTables::FindParentForFieldsByMap
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *pDVar2;
  FieldDescriptor *field_local;
  FileDescriptorTables *this_local;
  
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar2 = FieldDescriptor::extension_scope(field);
    if (pDVar2 == (Descriptor *)0x0) {
      this_local = (FileDescriptorTables *)FieldDescriptor::file(field);
    }
    else {
      this_local = (FileDescriptorTables *)FieldDescriptor::extension_scope(field);
    }
  }
  else {
    this_local = (FileDescriptorTables *)FieldDescriptor::containing_type(field);
  }
  return this_local;
}

Assistant:

const void* FileDescriptorTables::FindParentForFieldsByMap(
    const FieldDescriptor* field) const {
  if (field->is_extension()) {
    if (field->extension_scope() == nullptr) {
      return field->file();
    } else {
      return field->extension_scope();
    }
  } else {
    return field->containing_type();
  }
}